

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

lua_Number luaL_checknumber(lua_State *L,int idx)

{
  uint32_t *puVar1;
  int iVar2;
  TValue *o;
  TValue tmp;
  TValue local_20;
  
  o = index2adr(L,idx);
  if ((o->field_2).it < 0xffff0000) {
LAB_0010af0a:
    return (lua_Number)o->u64;
  }
  if ((o->field_2).it == 0xfffffffb) {
    puVar1 = &(o->u32).lo;
    o = &local_20;
    iVar2 = lj_strscan_num((GCstr *)(ulong)*puVar1,o);
    if (iVar2 != 0) goto LAB_0010af0a;
  }
  lj_err_argt(L,idx,3);
}

Assistant:

LUALIB_API lua_Number luaL_checknumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}